

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_lzma.c
# Opt level: O1

void compat_lzma(char *name)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  char *v2;
  char *pcVar3;
  ulong uVar4;
  undefined8 *puVar5;
  archive_entry *ae;
  archive_entry *local_38;
  
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                   ,L'l',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                      ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_filter_lzma((archive *)a);
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                   ,L'p');
    test_skipping("lzma reading not fully supported on this platform");
    wVar2 = L'q';
  }
  else {
    iVar1 = archive_read_support_format_all((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                        ,L't',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
    extract_reference_file(name);
    wVar2 = archive_read_open_filename(a,name,2);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                        ,L'v',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 2)",a)
    ;
    puVar5 = &DAT_00304990;
    uVar4 = 0;
    do {
      pcVar3 = (char *)*puVar5;
      failure("Could not read file %d (%s) from %s",uVar4 & 0xffffffff,pcVar3,name);
      iVar1 = archive_read_next_header((archive *)a,&local_38);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                          ,L'|',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
      v2 = archive_entry_pathname(local_38);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                 ,L'}',pcVar3,"n[i]",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      uVar4 = uVar4 + 1;
      puVar5 = puVar5 + 1;
    } while (uVar4 != 6);
    iVar1 = archive_read_next_header((archive *)a,&local_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                        ,L'\x81',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    iVar1 = archive_filter_code((archive *)a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                        ,L'\x84',(long)iVar1,"archive_filter_code(a, 0)",5,"ARCHIVE_FILTER_LZMA",
                        (void *)0x0);
    pcVar3 = archive_filter_name((archive *)a,0);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
               ,L'\x85',pcVar3,"archive_filter_name(a, 0)","lzma","\"lzma\"",(void *)0x0,L'\0');
    iVar1 = archive_format((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                        ,L'\x86',(long)iVar1,"archive_format(a)",0x30001,"ARCHIVE_FORMAT_TAR_USTAR",
                        (void *)0x0);
    iVar1 = archive_read_close((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                        ,L'\x88',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    wVar2 = L'\x89';
  }
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_lzma.c"
                      ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
compat_lzma(const char *name)
{
	const char *n[7] = { "f1", "f2", "f3", "d1/f1", "d1/f2", "d1/f3", NULL };
	struct archive_entry *ae;
	struct archive *a;
	int i, r;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_lzma(a);
	if (r == ARCHIVE_WARN) {
		skipping("lzma reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 2));

	/* Read entries, match up names with list above. */
	for (i = 0; i < 6; ++i) {
		failure("Could not read file %d (%s) from %s", i, n[i], name);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));
		assertEqualString(n[i], archive_entry_pathname(ae));
	}

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_LZMA);
	assertEqualString(archive_filter_name(a, 0), "lzma");
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_USTAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}